

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

qpTestResult __thiscall
gl4cts::ClipControlViewportBounds::ValidateFramebuffer
          (ClipControlViewportBounds *this,Context *context,GLenum origin)

{
  TestLog *log;
  RenderContext *context_00;
  bool bVar1;
  int y;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  Surface renderedFrame;
  Surface referenceFrame;
  PixelBufferAccess local_48;
  
  iVar2 = (*context->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var,iVar2);
  iVar2 = ((int *)CONCAT44(extraout_var,iVar2))[1];
  tcu::Surface::Surface(&renderedFrame,iVar3,iVar2);
  tcu::Surface::Surface(&referenceFrame,iVar3,iVar2);
  log = context->m_testCtx->m_log;
  iVar3 = 0;
  do {
    if (renderedFrame.m_height <= iVar3) {
      context_00 = context->m_renderCtx;
      tcu::Surface::getAccess(&local_48,&renderedFrame);
      glu::readPixels(context_00,0,0,&local_48);
      bVar1 = tcu::fuzzyCompare(log,"Result","Image comparison result",&referenceFrame,
                                &renderedFrame,0.05,COMPARE_LOG_RESULT);
      tcu::Surface::~Surface(&referenceFrame);
      tcu::Surface::~Surface(&renderedFrame);
      return (uint)!bVar1;
    }
    fVar5 = ((float)iVar3 / (float)renderedFrame.m_height + -0.25) * 4.0;
    for (iVar2 = 0; iVar2 < renderedFrame.m_width; iVar2 = iVar2 + 1) {
      fVar6 = (float)iVar2 / (float)renderedFrame.m_width + -0.125;
      fVar6 = fVar6 + fVar6;
      uVar4 = 0xffff0000;
      if ((0.0 < fVar6 && fVar6 < 1.0) && (0.0 < fVar5 && fVar5 < 1.0)) {
        if (origin == 0x8ca2) {
          if (0.5 < fVar5) {
LAB_00ab83e4:
            uVar4 = 0xff00ff00;
            if (fVar6 <= 0.5) goto LAB_00ab83f3;
          }
        }
        else if (fVar5 <= 0.5) goto LAB_00ab83e4;
        uVar4 = 0xff0000ff;
      }
LAB_00ab83f3:
      *(undefined4 *)
       ((long)referenceFrame.m_pixels.m_ptr + (long)(referenceFrame.m_width * iVar3 + iVar2) * 4) =
           uVar4;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

qpTestResult ValidateFramebuffer(deqp::Context& context, glw::GLenum origin)
	{
		const tcu::RenderTarget& renderTarget = context.getRenderContext().getRenderTarget();
		glw::GLuint				 windowW	  = renderTarget.getWidth();
		glw::GLuint				 windowH	  = renderTarget.getHeight();
		tcu::Surface			 renderedFrame(windowW, windowH);
		tcu::Surface			 referenceFrame(windowW, windowH);

		tcu::TestLog& log = context.getTestContext().getLog();

		for (int y = 0; y < renderedFrame.getHeight(); y++)
		{
			float yCoord   = (float)(y) / (float)renderedFrame.getHeight();
			float yVPCoord = (yCoord - 0.25f) * 4.0f;

			for (int x = 0; x < renderedFrame.getWidth(); x++)
			{
				float xCoord   = (float)(x) / (float)renderedFrame.getWidth();
				float xVPCoord = (xCoord - 0.125f) * 2.0f;

				if (xVPCoord > 0.0f && xVPCoord < 1.0f && yVPCoord > 0.0f && yVPCoord < 1.0f)
				{

					bool greenQuadrant;

					//inside viewport
					if (origin == GL_UPPER_LEFT)
					{
						greenQuadrant = (yVPCoord > 0.5f && xVPCoord <= 0.5f);
					}
					else
					{
						greenQuadrant = (yVPCoord <= 0.5f && xVPCoord <= 0.5f);
					}

					if (greenQuadrant)
					{
						referenceFrame.setPixel(x, y, tcu::RGBA::green());
					}
					else
					{
						referenceFrame.setPixel(x, y, tcu::RGBA::red());
					}
				}
				else
				{
					//outside viewport
					referenceFrame.setPixel(x, y, tcu::RGBA::blue());
				}
			}
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		if (tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f,
							  tcu::COMPARE_LOG_RESULT))
		{
			return QP_TEST_RESULT_PASS;
		}
		else
		{
			return QP_TEST_RESULT_FAIL;
		}
	}